

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O3

Vec_Int_t * Sdb_StoFindInputs(Vec_Wec_t *vCuts,int Front)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *p;
  int *piVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  undefined4 *__s;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  size_t __size;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar4 = (int *)malloc(400);
  p->pArray = piVar4;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_01->pArray = piVar4;
  iVar12 = vCuts->nSize;
  uVar10 = (ulong)iVar12;
  if ((long)uVar10 < 1) {
    uVar7 = 0;
    __size = 0x40;
    uVar5 = 1;
  }
  else {
    uVar5 = 0;
    uVar7 = 0;
    do {
      lVar6 = (long)vCuts->pArray[uVar5].nSize;
      if (0 < lVar6) {
        lVar8 = 0;
        do {
          uVar1 = vCuts->pArray[uVar5].pArray[lVar8];
          if ((int)uVar7 <= (int)uVar1) {
            uVar7 = uVar1;
          }
          lVar8 = lVar8 + 1;
        } while (lVar6 != lVar8);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar10);
    uVar5 = (ulong)(uVar7 + 1);
    uVar9 = 0x10;
    if (0xe < uVar7) {
      uVar9 = (ulong)(uVar7 + 1);
    }
    __size = uVar9 << 2;
  }
  __s = (undefined4 *)malloc(__size);
  if (__s != (undefined4 *)0x0) {
    memset(__s,0,uVar5 * 4);
  }
  if (0 < iVar12) {
    pVVar3 = vCuts->pArray;
    uVar9 = 0;
    do {
      if (0 < pVVar3[uVar9].nSize) {
        piVar4 = pVVar3[uVar9].pArray;
        lVar6 = 0;
        do {
          iVar12 = piVar4[lVar6];
          if (((long)iVar12 < 0) || ((int)uVar7 < iVar12)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          __s[iVar12] = __s[iVar12] + 1;
          lVar6 = lVar6 + 1;
        } while (lVar6 < pVVar3[uVar9].nSize);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar10);
  }
  *__s = 0;
  iVar12 = 1000000000;
  uVar10 = 0;
  do {
    iVar2 = __s[uVar10];
    iVar13 = iVar2;
    if (iVar12 < iVar2) {
      iVar13 = iVar12;
    }
    if (iVar2 == 0) {
      iVar13 = iVar12;
    }
    iVar12 = iVar13;
    uVar10 = uVar10 + 1;
  } while (uVar5 != uVar10);
  if (iVar12 == 1000000000) {
    return p;
  }
  uVar10 = 0;
  do {
    if (__s[uVar10] == iVar12) {
      Vec_IntPush(p_00,(int)uVar10);
      if ((int)uVar10 <= (int)uVar7) {
        __s[uVar10 & 0xffffffff] = 0;
        uVar10 = 0;
        do {
          if ((__s[uVar10] == iVar12) || (__s[uVar10] == iVar12 * 2)) {
            Vec_IntPush(p_00,(int)uVar10);
            __s[uVar10] = 0;
          }
          uVar10 = uVar10 + 1;
        } while (uVar5 != uVar10);
        if ((-1 < Front) && ((uint)Front <= uVar7)) {
          iVar12 = __s[(uint)Front];
          Vec_IntPush(p_01,Front);
          __s[(uint)Front] = 0;
          uVar10 = 0;
          do {
            if (__s[uVar10] == iVar12 * 2 || __s[uVar10] == iVar12) {
              Vec_IntPush(p_01,(int)uVar10);
              __s[uVar10] = 0;
            }
            uVar10 = uVar10 + 1;
          } while (uVar5 != uVar10);
          free(__s);
          uVar7 = p_00->nSize;
          lVar6 = (long)(int)uVar7;
          printf("Vector has %d entries: {",(ulong)uVar7);
          if (0 < lVar6) {
            piVar4 = p_00->pArray;
            lVar8 = 0;
            do {
              printf(" %d",(ulong)(uint)piVar4[lVar8]);
              lVar8 = lVar8 + 1;
            } while (lVar6 != lVar8);
          }
          puts(" }");
          uVar1 = p_01->nSize;
          lVar8 = (long)(int)uVar1;
          printf("Vector has %d entries: {",(ulong)uVar1);
          if (0 < lVar8) {
            piVar4 = p_01->pArray;
            lVar11 = 0;
            do {
              printf(" %d",(ulong)(uint)piVar4[lVar11]);
              lVar11 = lVar11 + 1;
            } while (lVar8 != lVar11);
          }
          puts(" }");
          if (0 < (int)uVar7) {
            piVar4 = p_00->pArray;
            lVar11 = 0;
            do {
              Vec_IntPush(p,piVar4[lVar11]);
              lVar11 = lVar11 + 1;
            } while (lVar6 != lVar11);
          }
          if (0 < (int)uVar1) {
            piVar4 = p_01->pArray;
            lVar6 = 0;
            do {
              Vec_IntPush(p,piVar4[lVar6]);
              lVar6 = lVar6 + 1;
            } while (lVar8 != lVar6);
          }
          if (p_00->pArray != (int *)0x0) {
            free(p_00->pArray);
          }
          free(p_00);
          if (p_01->pArray != (int *)0x0) {
            free(p_01->pArray);
          }
          free(p_01);
          return p;
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      goto LAB_006854bd;
    }
    uVar10 = uVar10 + 1;
  } while (uVar5 != uVar10);
  Vec_IntPush(p_00,-1);
LAB_006854bd:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

Vec_Int_t * Sdb_StoFindInputs( Vec_Wec_t * vCuts, int Front )
{
    int fVerbose = 0;
    Vec_Int_t * vCut, * vCounts;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Vec_Int_t * vResA = Vec_IntAlloc( 100 );
    Vec_Int_t * vResB = Vec_IntAlloc( 100 );
    int i, k, Entry, Max = 0, Min, MinValue;
    // find MAX value
    Vec_WecForEachLevel( vCuts, vCut, i )
        Vec_IntForEachEntry( vCut, Entry, k )
            Max = Abc_MaxInt( Max, Entry );
    // count how many times each value appears
    vCounts = Vec_IntStart( Max + 1 );
    Vec_WecForEachLevel( vCuts, vCut, i )
        Vec_IntForEachEntry( vCut, Entry, k )
            Vec_IntAddToEntry( vCounts, Entry, 1 );
    Vec_IntWriteEntry( vCounts, 0, 0 );
    // print out
    if ( fVerbose )
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry )
            printf( "%5d %5d\n", k, Entry );
    // collect first part
    MinValue = ABC_INFINITY;
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry )
            MinValue = Abc_MinInt( MinValue, Entry );
    if ( MinValue == ABC_INFINITY )
        return vRes;
    Min = Vec_IntFind( vCounts, MinValue );
    Vec_IntPush( vResA, Min );
    Vec_IntWriteEntry( vCounts, Min, 0 );
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry == MinValue || Entry == 2*MinValue )
        {
            Vec_IntPush( vResA, k );
            Vec_IntWriteEntry( vCounts, k, 0 );
        }
    // collect second parts
    MinValue = Vec_IntEntry( vCounts, Front );
    Min = Front;
    Vec_IntPush( vResB, Min );
    Vec_IntWriteEntry( vCounts, Min, 0 );
    Vec_IntForEachEntry( vCounts, Entry, k )
        if ( Entry == MinValue || Entry == 2*MinValue )
        {
            Vec_IntPush( vResB, k );
            Vec_IntWriteEntry( vCounts, k, 0 );
        }
    Vec_IntFree( vCounts );
    Vec_IntPrint( vResA );
    Vec_IntPrint( vResB );
    // here we need to order the inputs

    // append
    Vec_IntAppend( vRes, vResA );
    Vec_IntAppend( vRes, vResB );
    Vec_IntFree( vResA );
    Vec_IntFree( vResB );
    return vRes;
}